

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v6::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  char *__src;
  int iVar5;
  size_t __n;
  size_t in_R8;
  char *pcVar6;
  buffer<char> *c;
  string_view message_00;
  char *system_message;
  char *local_250;
  undefined **local_248;
  char *local_240;
  size_t local_238;
  ulong local_230;
  char local_228 [504];
  
  message_00.data_ = (char *)message.size_;
  local_240 = local_228;
  local_248 = &PTR_grow_001b4360;
  local_230 = 500;
  local_238 = 500;
  uVar1 = local_238;
  while (local_238 = uVar1, local_250 = local_240,
        iVar5 = internal::safe_strerror(error_code,&local_250,local_238), iVar5 == 0x22) {
    uVar1 = local_238 * 2;
    if (local_230 < uVar1) {
      (*(code *)*local_248)(&local_248,uVar1);
    }
  }
  if (iVar5 == 0) {
    sVar3 = out->size_;
    pcVar6 = message_00.data_ + sVar3;
    if ((char *)out->capacity_ < pcVar6) {
      (**out->_vptr_buffer)(out,pcVar6);
    }
    out->size_ = (size_t)pcVar6;
    if (message_00.data_ != (char *)0x0) {
      memmove(out->ptr_ + sVar3,message.data_,(size_t)message_00.data_);
      pcVar6 = (char *)out->size_;
    }
    pcVar2 = pcVar6 + 2;
    if ((char *)out->capacity_ < pcVar2) {
      (**out->_vptr_buffer)(out,pcVar2);
    }
    __src = local_250;
    out->size_ = (size_t)pcVar2;
    pcVar2 = out->ptr_;
    (pcVar2 + (long)pcVar6)[0] = ':';
    (pcVar2 + (long)pcVar6)[1] = ' ';
    __n = strlen(local_250);
    sVar3 = out->size_;
    uVar1 = __n + sVar3;
    if (out->capacity_ < uVar1) {
      (**out->_vptr_buffer)(out,uVar1);
    }
    out->size_ = uVar1;
    if (__n != 0) {
      memmove(out->ptr_ + sVar3,__src,__n);
    }
    bVar4 = false;
  }
  else {
    bVar4 = true;
  }
  local_248 = &PTR_grow_001b4360;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  if (bVar4) {
    message_00.size_ = in_R8;
    internal::format_error_code
              ((internal *)out,(buffer<char> *)(ulong)(uint)error_code,(int)message.data_,message_00
              );
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(internal::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          internal::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        internal::writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }